

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

void __thiscall
Hpipe::Instruction::apply_rec_rewind_l
          (Instruction *this,function<void_(Hpipe::Instruction_*,_unsigned_int)> *f,
          uint rewind_level)

{
  pointer pTVar1;
  Instruction *pIVar2;
  pointer pTVar3;
  uint local_5c;
  Instruction *local_58;
  _Any_data local_50;
  code *local_40;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    local_5c = rewind_level;
    local_58 = this;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*f->_M_invoker)((_Any_data *)f,&local_58,&local_5c);
    pTVar3 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar3 != pTVar1) {
      do {
        pIVar2 = pTVar3->inst;
        std::function<void_(Hpipe::Instruction_*,_unsigned_int)>::function
                  ((function<void_(Hpipe::Instruction_*,_unsigned_int)> *)&local_50,f);
        (*pIVar2->_vptr_Instruction[9])(pIVar2,&local_50,(ulong)rewind_level);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        pTVar3 = pTVar3 + 1;
      } while (pTVar3 != pTVar1);
    }
  }
  return;
}

Assistant:

void Instruction::apply_rec_rewind_l( std::function<void (Instruction *, unsigned)> f, unsigned rewind_level ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    f( this, rewind_level );

    for( Transition &t : next )
        t.inst->apply_rec_rewind_l( f, rewind_level );
}